

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Diag(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  long lVar3;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> local_a0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> pivot;
  
  lVar3 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  if (lVar3 != CONCAT44(extraout_var,iVar1)) {
    Error("TPZMatrix::Subst_Diag incompatible dimensions\n",(char *)0x0);
  }
  lVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar1) <= lVar3) break;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&pivot,this,lVar3,lVar3);
    for (lVar2 = 0; lVar2 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
        lVar2 = lVar2 + 1) {
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(&local_90,B,lVar3,lVar2);
      local_a0.fadexpr_.left_ = &local_90;
      local_a0.fadexpr_.right_ = &pivot;
      Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>(&local_70,&local_a0);
      (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x23])(B,lVar3,lVar2,&local_70);
      Fad<double>::~Fad(&local_70);
      Fad<double>::~Fad(&local_90);
    }
    Fad<double>::~Fad(&pivot);
    lVar3 = lVar3 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}